

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O3

bool __thiscall QPDF::findStartxref(QPDF *this)

{
  _Head_base<0UL,_QPDF::Members_*,_false> _Var1;
  InputSource *this_00;
  int iVar2;
  qpdf_offset_t qVar3;
  bool bVar4;
  long *local_108;
  size_t local_100;
  long local_f8 [2];
  Token local_e8;
  Token local_80;
  
  _Var1._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  ::qpdf::Tokenizer::readToken
            (&local_e8,&(_Var1._M_head_impl)->tokenizer,
             ((_Var1._M_head_impl)->file).
             super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &(_Var1._M_head_impl)->last_object_description,true,0);
  local_108 = local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"startxref","");
  if ((local_e8.type == tt_word) && (local_e8.value._M_string_length == local_100)) {
    if (local_e8.value._M_string_length != 0) {
      iVar2 = bcmp(local_e8.value._M_dataplus._M_p,local_108,local_e8.value._M_string_length);
      if (iVar2 != 0) goto LAB_0022353b;
    }
    _Var1._M_head_impl =
         (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
         _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    ::qpdf::Tokenizer::readToken
              (&local_80,&(_Var1._M_head_impl)->tokenizer,
               ((_Var1._M_head_impl)->file).
               super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               &(_Var1._M_head_impl)->last_object_description,true,0);
    bVar4 = local_80.type == tt_integer;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80.error_message._M_dataplus._M_p != &local_80.error_message.field_2) {
      operator_delete(local_80.error_message._M_dataplus._M_p,
                      local_80.error_message.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80.raw_value._M_dataplus._M_p != &local_80.raw_value.field_2) {
      operator_delete(local_80.raw_value._M_dataplus._M_p,
                      local_80.raw_value.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80.value._M_dataplus._M_p != &local_80.value.field_2) {
      operator_delete(local_80.value._M_dataplus._M_p,
                      local_80.value.field_2._M_allocated_capacity + 1);
    }
  }
  else {
LAB_0022353b:
    bVar4 = false;
  }
  if (local_108 != local_f8) {
    operator_delete(local_108,local_f8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.error_message._M_dataplus._M_p != &local_e8.error_message.field_2) {
    operator_delete(local_e8.error_message._M_dataplus._M_p,
                    local_e8.error_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.raw_value._M_dataplus._M_p != &local_e8.raw_value.field_2) {
    operator_delete(local_e8.raw_value._M_dataplus._M_p,
                    local_e8.raw_value.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.value._M_dataplus._M_p != &local_e8.value.field_2) {
    operator_delete(local_e8.value._M_dataplus._M_p,local_e8.value.field_2._M_allocated_capacity + 1
                   );
  }
  if (bVar4 != false) {
    this_00 = (((this->m)._M_t.
                super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
              super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    qVar3 = InputSource::getLastOffset(this_00);
    (*this_00->_vptr_InputSource[5])(this_00,qVar3,0);
  }
  return bVar4;
}

Assistant:

bool
QPDF::findStartxref()
{
    if (readToken(*m->file).isWord("startxref") && readToken(*m->file).isInteger()) {
        // Position in front of offset token
        m->file->seek(m->file->getLastOffset(), SEEK_SET);
        return true;
    }
    return false;
}